

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjDumpParser.cpp
# Opt level: O2

bool expectAsmBytes(char **data)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  
  pcVar3 = *data;
  lVar4 = 0;
  pcVar1 = pcVar3;
  do {
    if ((int)lVar4 == -0x15) {
LAB_001177f3:
      pcVar3 = pcVar3 + (1 - lVar4);
      while (iVar2 = isspace((int)pcVar3[-1]), iVar2 != 0) {
        *data = pcVar3;
        pcVar3 = pcVar3 + 1;
      }
      return true;
    }
    iVar2 = isxdigit((int)*pcVar1);
    if (((iVar2 == 0) || (iVar2 = isxdigit((int)pcVar1[1]), iVar2 == 0)) ||
       (iVar2 = isspace((int)pcVar1[2]), iVar2 == 0)) {
      if ((int)lVar4 == 0) {
        return false;
      }
      goto LAB_001177f3;
    }
    *data = pcVar1 + 3;
    lVar4 = lVar4 + -3;
    pcVar1 = pcVar1 + 3;
  } while( true );
}

Assistant:

inline bool expectAsmBytes(char *&data)
{
    for (int i = 0; i < 7; i++) {
        if (!(isxdigit(data[0]) && isxdigit(data[1]) && isspace(data[2]))) {
            if (i == 0) {
                return false;
            }
            break;
        }
        data += 3;
    }

    while (isspace(*data)) {
        ++data;
    }
    return true;
}